

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *metavar,char *help,
          Callback *callback)

{
  allocator local_123;
  allocator local_122;
  allocator local_121;
  string local_120;
  string local_100;
  string local_e0;
  Option option;
  
  std::__cxx11::string::string((string *)&local_120,long_name,&local_121);
  std::__cxx11::string::string((string *)&local_e0,metavar,&local_122);
  std::__cxx11::string::string((string *)&local_100,help,&local_123);
  Option::Option(&option,short_name,&local_120,&local_e0,Yes,&local_100,callback);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>>::
  emplace_back<wabt::OptionParser::Option_const&>
            ((vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>> *)
             &this->options_,&option);
  Option::~Option(&option);
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* metavar,
                             const char* help,
                             const Callback& callback) {
  Option option(short_name, long_name, metavar, HasArgument::Yes, help,
                callback);
  AddOption(option);
}